

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O3

X * __thiscall IMLE<1,_1,_FastLinearExpert>::predict(IMLE<1,_1,_FastLinearExpert> *this,Z *z)

{
  double *pdVar1;
  double *pdVar2;
  ArrayX *this_00;
  pointer *ppMVar3;
  double *pdVar4;
  double dVar5;
  pointer pMVar6;
  pointer pdVar7;
  iterator iVar8;
  pointer pFVar9;
  pointer piVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double *pdVar13;
  double *pdVar14;
  ulong uVar15;
  undefined8 *puVar16;
  Index col;
  long lVar17;
  ulong uVar18;
  plain_array<double,_1,_0,_0> *__x;
  SrcEvaluatorType srcEvaluator;
  long lVar19;
  ulong uVar20;
  Z *pZVar21;
  int iVar22;
  ActualDstType actualDst;
  iterator __position;
  long lVar23;
  ArrayScal *this_01;
  long lVar24;
  long lVar25;
  long lVar26;
  double __tmp;
  double dVar27;
  Scal SVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  X sumInvRj;
  X sumInvRxj;
  plain_array<double,_1,_0,_0> local_80;
  plain_array<double,_1,_0,_0> local_78;
  Z *local_70;
  ArrayX *local_68;
  long local_60;
  ArrayX *local_58;
  ArrayScal *local_50;
  IMLE<1,_1,_FastLinearExpert> *local_48;
  long local_40;
  double local_38;
  
  pMVar6 = (this->predictions).
           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           .
           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->predictions).
      super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      .
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pMVar6) {
    (this->predictions).
    super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    .
    super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar6;
  }
  pMVar6 = (this->predictionsVar).
           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           .
           super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->predictionsVar).
      super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      .
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pMVar6) {
    (this->predictionsVar).
    super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    .
    super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pMVar6;
  }
  pdVar7 = (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar7) {
    (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar7;
  }
  if (this->M < 1) {
    dVar27 = 0.0;
  }
  else {
    dVar27 = 0.0;
    lVar25 = 0;
    lVar19 = 0;
    do {
      SVar28 = LinearExpert<1,_1>::queryZ
                         ((LinearExpert<1,_1> *)
                          ((long)&(((this->experts).
                                    super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                                    .
                                    super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super_LinearExpert<1,_1>).Nu + lVar25),z);
      dVar27 = dVar27 + SVar28;
      lVar19 = lVar19 + 1;
      lVar25 = lVar25 + 0x1a8;
    } while (lVar19 < this->M);
  }
  pdVar13 = (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
            .m_data;
  if ((this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows != 1) {
    free(pdVar13);
    pdVar13 = (double *)malloc(8);
    if (pdVar13 == (double *)0x0) goto LAB_00146b8d;
    (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
         = pdVar13;
  }
  (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
       1;
  *pdVar13 = dVar27;
  dVar27 = dVar27 + this->pNoiseModelZ;
  pdVar14 = (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
  local_70 = z;
  if ((this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != 1) {
    free(pdVar14);
    pdVar14 = (double *)malloc(8);
    if (pdVar14 == (double *)0x0) goto LAB_00146b8d;
    (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         pdVar14;
    pdVar13 = (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data;
  }
  local_68 = &this->predictions;
  this_00 = &this->predictionsVar;
  (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 1;
  *pdVar14 = dVar27;
  this->sumAll = dVar27;
  this_01 = &this->predictionsWeight;
  iVar22 = this->M;
  lVar25 = (long)iVar22;
  lVar19 = (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_rows;
  if ((*pdVar13 != 0.0) || (NAN(*pdVar13))) {
    lVar23 = lVar25;
    local_58 = this_00;
    local_50 = this_01;
    if (lVar19 != lVar25) {
      free((this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      if (iVar22 < 1) {
        pdVar13 = (double *)0x0;
      }
      else {
        pdVar13 = (double *)malloc(lVar25 * 8);
        if (pdVar13 == (double *)0x0) goto LAB_00146b8d;
      }
      (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data = pdVar13;
      iVar22 = this->M;
      lVar23 = (long)iVar22;
    }
    (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = lVar25;
    if ((iVar22 != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar23),0) < 1))
    goto LAB_00146b8d;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&this->fInvRj,lVar23,1,lVar23);
    lVar19 = (long)this->M;
    if ((lVar19 != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar19),0) < 1))
    goto LAB_00146b8d;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&this->invRxj,lVar19,1,lVar19);
    pZVar21 = local_70;
    if (0 < this->M) {
      local_60 = 0;
      lVar25 = 0;
      lVar23 = 0;
      lVar19 = 0xe0;
      do {
        local_40 = lVar19;
        pFVar9 = (this->experts).
                 super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                 .
                 super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        dVar27 = pFVar9[lVar23].super_LinearExpert<1,_1>.gamma *
                 pFVar9[lVar23].super_LinearExpert<1,_1>.p_z_T +
                 *(this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                  m_storage.m_data;
        (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
        m_data[lVar23] = dVar27;
        pdVar13 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
        lVar19 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        if (0 < lVar19) {
          dVar5 = pFVar9[lVar23].super_LinearExpert<1,_1>.p_z_T;
          lVar17 = 0;
          do {
            *(double *)((long)pdVar13 + lVar17 * 8 + lVar19 * lVar25) =
                 (double)pFVar9[lVar23].super_LinearExpert<1,_1>.invPsi.
                         super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage *
                 (dVar5 / dVar27);
            lVar17 = lVar17 + 1;
          } while (lVar19 != lVar17);
        }
        pdVar14 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_data;
        uVar18 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_rows;
        uVar15 = uVar18;
        if ((((ulong)(pdVar14 + uVar18 * lVar23) & 7) == 0) &&
           (uVar15 = (ulong)((uint)((ulong)(pdVar14 + uVar18 * lVar23) >> 3) & 1),
           (long)uVar18 <= (long)uVar15)) {
          uVar15 = uVar18;
        }
        if (0 < (long)uVar15) {
          uVar20 = 0;
          do {
            *(double *)((long)pdVar14 + uVar20 * 8 + uVar18 * lVar25) =
                 pdVar13[lVar19 * lVar23] *
                 *(double *)((long)&(pFVar9->super_LinearExpert<1,_1>).Nu + uVar20 * 8 + local_40);
            uVar20 = uVar20 + 1;
          } while (uVar15 != uVar20);
        }
        lVar24 = uVar18 - uVar15;
        lVar17 = (lVar24 - (lVar24 >> 0x3f) & 0xfffffffffffffffeU) + uVar15;
        if (1 < lVar24) {
          uVar20 = uVar15;
          do {
            pdVar4 = (double *)
                     ((long)&(pFVar9->super_LinearExpert<1,_1>).pred_x + uVar20 * 8 + local_60);
            dVar27 = pdVar4[1];
            pdVar1 = (double *)((long)pdVar13 + uVar20 * 8 + lVar19 * lVar25);
            dVar5 = pdVar1[1];
            pdVar2 = (double *)((long)pdVar14 + uVar20 * 8 + uVar18 * lVar25);
            *pdVar2 = *pdVar1 * *pdVar4;
            pdVar2[1] = dVar5 * dVar27;
            uVar20 = uVar20 + 2;
          } while ((long)uVar20 < lVar17);
        }
        if (lVar17 < (long)uVar18) {
          lVar26 = (lVar24 / 2) * 0x10;
          lVar17 = 0;
          do {
            *(double *)((long)pdVar14 + lVar17 * 8 + uVar18 * lVar25 + lVar26 + uVar15 * 8) =
                 pdVar13[lVar19 * lVar23] *
                 *(double *)
                  ((long)&(pFVar9->super_LinearExpert<1,_1>).Nu +
                  lVar17 * 8 + lVar26 + local_40 + uVar15 * 8);
            lVar17 = lVar17 + 1;
          } while (lVar24 % 2 != lVar17);
        }
        lVar23 = lVar23 + 1;
        lVar25 = lVar25 + 8;
        local_60 = local_60 + 0x1a8;
        lVar19 = local_40 + 0x1a8;
        local_48 = this;
      } while (lVar23 < this->M);
    }
    pdVar13 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data;
    lVar19 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols;
    if (((ulong)&local_78 & 8) == 0) {
      if (lVar19 == 0) {
LAB_001469b9:
        local_78.array[0] = (double  [1])0.0;
      }
      else {
        local_78.array[0] = (double  [1])*pdVar13;
        if (1 < lVar19) {
          lVar19 = lVar19 + -1;
          do {
            pdVar13 = pdVar13 + (this->fInvRj).
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_rows;
            local_78.array[0] = (double  [1])((double)local_78.array[0] + *pdVar13);
            lVar19 = lVar19 + -1;
          } while (lVar19 != 0);
        }
      }
    }
    else {
      if (lVar19 == 0) goto LAB_001469b9;
      local_78.array[0] = (double  [1])*pdVar13;
      if (1 < lVar19) {
        lVar19 = lVar19 + -1;
        do {
          pdVar13 = pdVar13 + (this->fInvRj).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_rows;
          local_78.array[0] = (double  [1])((double)local_78.array[0] + *pdVar13);
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
      }
    }
    pdVar13 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data;
    lVar19 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols;
    if (((ulong)&local_38 & 8) == 0) {
      if (lVar19 == 0) {
LAB_00146a3d:
        local_38 = 0.0;
      }
      else {
        local_38 = *pdVar13;
        if (1 < lVar19) {
          lVar19 = lVar19 + -1;
          do {
            pdVar13 = pdVar13 + (this->invRxj).
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_rows;
            local_38 = local_38 + *pdVar13;
            lVar19 = lVar19 + -1;
          } while (lVar19 != 0);
        }
      }
    }
    else {
      if (lVar19 == 0) goto LAB_00146a3d;
      local_38 = *pdVar13;
      if (1 < lVar19) {
        lVar19 = lVar19 + -1;
        do {
          pdVar13 = pdVar13 + (this->invRxj).
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_rows;
          local_38 = local_38 + *pdVar13;
          lVar19 = lVar19 + -1;
        } while (lVar19 != 0);
      }
    }
    local_80.array[0] = (double  [1])(local_38 / (double)local_78.array[0]);
    iVar8._M_current =
         (this->predictions).
         super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         .
         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar8._M_current ==
        (this->predictions).
        super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        .
        super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::_M_realloc_insert(&local_68->
                           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                          ,iVar8,(value_type *)&local_80);
    }
    else {
      ((iVar8._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.
      m_data.array[0] = (double)local_80.array[0];
      ppMVar3 = &(this->predictions).
                 super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 .
                 super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppMVar3 = *ppMVar3 + 1;
    }
    local_80.array[0] = (double  [1])(1.0 / (double)local_78.array[0]);
    iVar8._M_current =
         (this->predictionsVar).
         super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         .
         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar8._M_current ==
        (this->predictionsVar).
        super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        .
        super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::_M_realloc_insert(&local_58->
                           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                          ,iVar8,(value_type *)&local_80);
    }
    else {
      ((iVar8._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.
      m_data.array[0] = (double)local_80.array[0];
      ppMVar3 = &(this->predictionsVar).
                 super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 .
                 super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppMVar3 = *ppMVar3 + 1;
    }
    local_80.array[0] =
         (double  [1])
         (*(this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data / this->sumAll);
    __position._M_current =
         (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      __x = &local_80;
      this_01 = local_50;
LAB_00146b0f:
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert(this_01,__position,__x->array)
      ;
      goto LAB_00146b14;
    }
    *__position._M_current = (double)local_80.array[0];
  }
  else {
    if (lVar19 != lVar25) {
      free((this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      if (iVar22 < 1) {
        pdVar13 = (double *)0x0;
      }
      else {
        pdVar13 = (double *)malloc(lVar25 * 8);
        if (pdVar13 == (double *)0x0) goto LAB_00146b8d;
      }
      (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_data = pdVar13;
    }
    (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
    m_rows = lVar25;
    auVar12 = _DAT_001680b0;
    auVar11 = _DAT_001680a0;
    if (0 < iVar22) {
      SVar28 = this->pNoiseModelZ;
      pdVar13 = (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data;
      uVar18 = lVar25 + 0x1fffffffffffffffU & 0x1fffffffffffffff;
      auVar29._8_4_ = (int)uVar18;
      auVar29._0_8_ = uVar18;
      auVar29._12_4_ = (int)(uVar18 >> 0x20);
      lVar19 = 0;
      auVar29 = auVar29 ^ _DAT_001680b0;
      do {
        auVar30._8_4_ = (int)lVar19;
        auVar30._0_8_ = lVar19;
        auVar30._12_4_ = (int)((ulong)lVar19 >> 0x20);
        auVar30 = (auVar30 | auVar11) ^ auVar12;
        if ((bool)(~(auVar30._4_4_ == auVar29._4_4_ && auVar29._0_4_ < auVar30._0_4_ ||
                    auVar29._4_4_ < auVar30._4_4_) & 1)) {
          pdVar13[lVar19] = SVar28;
        }
        if ((auVar30._12_4_ != auVar29._12_4_ || auVar30._8_4_ <= auVar29._8_4_) &&
            auVar30._12_4_ <= auVar29._12_4_) {
          pdVar13[lVar19 + 1] = SVar28;
        }
        lVar19 = lVar19 + 2;
      } while ((uVar18 - ((uint)(lVar25 + 0x1fffffffffffffffU) & 1)) + 2 != lVar19);
    }
    lVar19 = (long)this->M;
    if ((lVar19 != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar19),0) < 1)) {
LAB_00146b8d:
      puVar16 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar16 = operator_delete;
      __cxa_throw(puVar16,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&this->fInvRj,lVar19,1,lVar19);
    pZVar21 = local_70;
    lVar19 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols *
             (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    if (0 < lVar19) {
      memset((this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data,0,lVar19 * 8);
    }
    lVar19 = (long)this->M;
    if ((lVar19 != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar19),0) < 1))
    goto LAB_00146b8d;
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&this->invRxj,lVar19,1,lVar19);
    lVar19 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_cols *
             (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_rows;
    if (0 < lVar19) {
      memset((this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
             m_storage.m_data,0,lVar19 * 8);
    }
    iVar8._M_current =
         (this->predictions).
         super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         .
         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar8._M_current ==
        (this->predictions).
        super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        .
        super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::_M_realloc_insert(&local_68->
                           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                          ,iVar8,&this->zeroX);
    }
    else {
      ((iVar8._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.
      m_data.array[0] =
           (this->zeroX).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
           m_data.array[0];
      ppMVar3 = &(this->predictions).
                 super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 .
                 super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppMVar3 = *ppMVar3 + 1;
    }
    iVar8._M_current =
         (this->predictionsVar).
         super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         .
         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar8._M_current ==
        (this->predictionsVar).
        super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        .
        super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ::_M_realloc_insert(&this_00->
                           super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                          ,iVar8,&this->infinityX);
    }
    else {
      ((iVar8._M_current)->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.
      m_data.array[0] =
           (this->infinityX).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.
           m_data.array[0];
      ppMVar3 = &(this->predictionsVar).
                 super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 .
                 super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppMVar3 = *ppMVar3 + 1;
    }
    local_78.array[0] = (double  [1])0.0;
    __position._M_current =
         (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      __x = &local_78;
      goto LAB_00146b0f;
    }
    *__position._M_current = 0.0;
  }
  (this->predictionsWeight).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = __position._M_current + 1;
LAB_00146b14:
  this->nSolFound = 1;
  piVar10 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar10) {
    (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar10;
  }
  std::vector<int,_std::allocator<int>_>::resize(&this->sNearest,(long)this->M,0);
  this->solIdx = 0;
  (this->zQuery).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage.m_data.array
  [0] = (pZVar21->super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>).m_storage.m_data.
        array[0];
  this->hasPredJacobian = false;
  this->hasPredErrorReductionDrvt = false;
  return (this->predictions).
         super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         .
         super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
}

Assistant:

IMLE_CLASS_TEMPLATE
IMLE_TYPENAME IMLE_base::X const &IMLE_base::predict(Z const &z)
{

    // Clear predict data structure
    predictions.clear();
    predictionsVar.clear();
    predictionsWeight.clear();

#ifdef IMLE_NO_TEMPLATES
    // Check dimensions
    if( z.size() != d )
    {
        message("IMLE::predict: query dimension does not match input dimension!!");

        sum_p_z.setZero(1);
    }
    else
#endif
    {
        Scal sum_p = 0.0;
        for(int j = 0; j < M; j++)
            sum_p += experts[j].queryZ(z);
        sum_p_z.setConstant(1, sum_p);
        sumW.setConstant(1, sum_p + pNoiseModelZ);
        sumAll = sumW(0);
    }

    if(sum_p_z(0) == 0.0)  // This happens when a prediction is sought too far from the current mixture
    {
        varPhiAuxj.setConstant(M,pNoiseModelZ);
        fInvRj.setZero(D,M);
        invRxj.setZero(D,M);

        predictions.push_back(zeroX);
        predictionsVar.push_back(infinityX);
        predictionsWeight.push_back(0.0);
    }
    else
    {
        varPhiAuxj.resize(M);
        fInvRj.resize(D,M);
        invRxj.resize(D,M);
        for(int j = 0; j < M; j++)
        {
            varPhiAuxj(j) = experts[j].getGamma() * experts[j].get_p_z() + sumW(0);
            fInvRj.col(j) = experts[j].getPredXInvVar() * (experts[j].get_p_z() / varPhiAuxj(j));
            invRxj.col(j) = fInvRj.col(j).asDiagonal() * experts[j].getPredX();
        }

        // Update storage results
        X sumInvRj = fInvRj.rowwise().sum();
        X sumInvRxj = invRxj.rowwise().sum();

        predictions.push_back( sumInvRxj.cwiseQuotient(sumInvRj) );
        predictionsVar.push_back( sumInvRj.cwiseInverse() );
        predictionsWeight.push_back( sum_p_z(0) / sumAll );
    }

    nSolFound = 1;
    sNearest.clear();
    sNearest.resize(M,0);

    solIdx = 0;

    zQuery = z;
    hasPredJacobian = false;
    hasPredErrorReductionDrvt = false;

    return predictions[solIdx];
}